

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.hpp
# Opt level: O0

expected<void,_int> * __thiscall
nonstd::expected_lite::expected<void,_int>::operator=
          (expected<void,_int> *this,expected<void,_int> *other)

{
  expected<void,_int> local_20;
  expected<void,_int> *local_18;
  expected<void,_int> *other_local;
  expected<void,_int> *this_local;
  
  local_18 = other;
  other_local = this;
  expected(&local_20,other);
  swap<int>(&local_20,this);
  ~expected(&local_20);
  return this;
}

Assistant:

expected & operator=( expected && other ) noexcept
    (
        std::is_nothrow_move_assignable<E>::value &&
        std::is_nothrow_move_constructible<E>::value )
    {
        expected( std::move( other ) ).swap( *this );
        return *this;
    }